

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_15::ConsoleReporter::logTestStart(ConsoleReporter *this)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  ulong local_20;
  size_t i_1;
  size_t i;
  ConsoleReporter *this_local;
  
  if ((this->hasLoggedCurrentTestStart & 1U) == 0) {
    separator_to_stream(this);
    pcVar2 = String::c_str(&this->tc->m_file);
    (*(this->super_IReporter)._vptr_IReporter[0xe])(this,pcVar2,(ulong)this->tc->m_line,"\n");
    if (this->tc->m_description != (char *)0x0) {
      poVar3 = Color::operator<<(this->s,Yellow);
      poVar3 = std::operator<<(poVar3,"DESCRIPTION: ");
      poVar3 = Color::operator<<(poVar3,None);
      poVar3 = std::operator<<(poVar3,this->tc->m_description);
      std::operator<<(poVar3,"\n");
    }
    if ((this->tc->m_test_suite != (char *)0x0) && (*this->tc->m_test_suite != '\0')) {
      poVar3 = Color::operator<<(this->s,Yellow);
      poVar3 = std::operator<<(poVar3,"TEST SUITE: ");
      poVar3 = Color::operator<<(poVar3,None);
      poVar3 = std::operator<<(poVar3,this->tc->m_test_suite);
      std::operator<<(poVar3,"\n");
    }
    iVar1 = strncmp(this->tc->m_name,"  Scenario:",0xb);
    if (iVar1 != 0) {
      poVar3 = Color::operator<<(this->s,Yellow);
      std::operator<<(poVar3,"TEST CASE:  ");
    }
    poVar3 = Color::operator<<(this->s,None);
    poVar3 = std::operator<<(poVar3,this->tc->m_name);
    std::operator<<(poVar3,"\n");
    for (i_1 = 0; i_1 < this->currentSubcaseLevel; i_1 = i_1 + 1) {
      pvVar4 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
               operator[](&this->subcasesStack,i_1);
      pcVar2 = String::operator[](&pvVar4->m_name,0);
      if (*pcVar2 != '\0') {
        poVar3 = std::operator<<(this->s,"  ");
        pvVar4 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                 ::operator[](&this->subcasesStack,i_1);
        poVar3 = doctest::operator<<(poVar3,&pvVar4->m_name);
        std::operator<<(poVar3,"\n");
      }
    }
    sVar6 = this->currentSubcaseLevel;
    sVar5 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::size
                      (&this->subcasesStack);
    if (sVar6 != sVar5) {
      poVar3 = Color::operator<<(this->s,Yellow);
      poVar3 = std::operator<<(poVar3,
                               "\nDEEPEST SUBCASE STACK REACHED (DIFFERENT FROM THE CURRENT ONE):\n"
                              );
      Color::operator<<(poVar3,None);
      for (local_20 = 0;
          sVar6 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                  ::size(&this->subcasesStack), local_20 < sVar6; local_20 = local_20 + 1) {
        pvVar4 = std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                 ::operator[](&this->subcasesStack,local_20);
        pcVar2 = String::operator[](&pvVar4->m_name,0);
        if (*pcVar2 != '\0') {
          poVar3 = std::operator<<(this->s,"  ");
          pvVar4 = std::
                   vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
                   operator[](&this->subcasesStack,local_20);
          poVar3 = doctest::operator<<(poVar3,&pvVar4->m_name);
          std::operator<<(poVar3,"\n");
        }
      }
    }
    std::operator<<(this->s,"\n");
    this->hasLoggedCurrentTestStart = true;
  }
  return;
}

Assistant:

void logTestStart() {
            if(hasLoggedCurrentTestStart)
                return;

            separator_to_stream();
            file_line_to_stream(tc->m_file.c_str(), tc->m_line, "\n");
            if(tc->m_description)
                s << Color::Yellow << "DESCRIPTION: " << Color::None << tc->m_description << "\n";
            if(tc->m_test_suite && tc->m_test_suite[0] != '\0')
                s << Color::Yellow << "TEST SUITE: " << Color::None << tc->m_test_suite << "\n";
            if(strncmp(tc->m_name, "  Scenario:", 11) != 0)
                s << Color::Yellow << "TEST CASE:  ";
            s << Color::None << tc->m_name << "\n";

            for(size_t i = 0; i < currentSubcaseLevel; ++i) {
                if(subcasesStack[i].m_name[0] != '\0')
                    s << "  " << subcasesStack[i].m_name << "\n";
            }

            if(currentSubcaseLevel != subcasesStack.size()) {
                s << Color::Yellow << "\nDEEPEST SUBCASE STACK REACHED (DIFFERENT FROM THE CURRENT ONE):\n" << Color::None;
                for(size_t i = 0; i < subcasesStack.size(); ++i) {
                    if(subcasesStack[i].m_name[0] != '\0')
                        s << "  " << subcasesStack[i].m_name << "\n";
                }
            }

            s << "\n";

            hasLoggedCurrentTestStart = true;
        }